

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.h
# Opt level: O0

ostream * operator<<(ostream *o,Bounds *bounds)

{
  ostream *poVar1;
  Bounds *bounds_local;
  ostream *o_local;
  
  poVar1 = std::operator<<(o,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,bounds->lower);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,bounds->upper);
  std::operator<<(poVar1,")");
  return o;
}

Assistant:

std::ostream& operator << (std::ostream &o, const Bounds &bounds)
{
	o << "(" << bounds.lower << ", " << bounds.upper << ")";
	return o;
}